

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandGenFsm(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_44 = 10;
  local_40 = 100;
  local_3c = 0x14;
  local_34 = 1;
  local_38 = 0x1e;
  local_48 = 100;
LAB_0020ed2a:
  while (iVar3 = Extra_UtilGetopt(argc,argv,"IOSLPQvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  switch(iVar3) {
  case 0x49:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
      break;
    }
    uVar4 = atoi(argv[globalUtilOptind]);
    local_38 = uVar4;
LAB_0020ee3a:
    globalUtilOptind = iVar2 + 1;
    if ((int)uVar4 < 0) {
switchD_0020ed5c_caseD_4a:
      Abc_Print(-2,"usage: genfsm [-IOSLPQ num] [-vh] <file>\n");
      Abc_Print(-2,"\t         generates random FSM in KISS format\n");
      Abc_Print(-2,"\t-I num : the number of input variables [default = %d]\n",(ulong)local_38);
      Abc_Print(-2,"\t-O num : the number of output variables [default = %d]\n",(ulong)local_34);
      Abc_Print(-2,"\t-S num : the number of state variables [default = %d]\n",(ulong)local_3c);
      Abc_Print(-2,"\t-L num : the number of lines (product terms) [default = %d]\n",(ulong)local_40
               );
      Abc_Print(-2,
                "\t-P num : percentage propability of a variable present in the input cube [default = %d]\n"
                ,(ulong)local_44);
      Abc_Print(-2,
                "\t-Q num : percentage propability of a variable present in the output cube [default = %d]\n"
                ,(ulong)local_48);
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : output file name\n");
      return 1;
    }
    goto LAB_0020ed2a;
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x52:
    goto switchD_0020ed5c_caseD_4a;
  case 0x4c:
    if (globalUtilOptind < argc) {
      uVar4 = atoi(argv[globalUtilOptind]);
      local_40 = uVar4;
      goto LAB_0020ee3a;
    }
    pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4f:
    if (globalUtilOptind < argc) {
      uVar4 = atoi(argv[globalUtilOptind]);
      local_34 = uVar4;
      goto LAB_0020ee3a;
    }
    pcVar5 = "Command line switch \"-O\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      uVar4 = atoi(argv[globalUtilOptind]);
      local_44 = uVar4;
      goto LAB_0020ee3a;
    }
    pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x51:
    if (globalUtilOptind < argc) {
      uVar4 = atoi(argv[globalUtilOptind]);
      local_48 = uVar4;
      goto LAB_0020ee3a;
    }
    pcVar5 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      uVar4 = atoi(argv[globalUtilOptind]);
      local_3c = uVar4;
      goto LAB_0020ee3a;
    }
    pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  default:
    if ((iVar3 != -1) || (globalUtilOptind + 1 != argc)) goto switchD_0020ed5c_caseD_4a;
    pcVar5 = "The number of inputs. states, lines, and probablity should be positive integers.\n";
    if (((local_38 != 0) && (((local_3c != 0 && (local_40 != 0)) && (local_44 != 0)))) &&
       (local_48 != 0)) {
      Abc_GenFsm(argv[globalUtilOptind],local_38,local_34,local_3c,local_40,local_44,local_48);
      return 0;
    }
  }
  Abc_Print(-1,pcVar5);
  goto switchD_0020ed5c_caseD_4a;
}

Assistant:

int Abc_CommandGenFsm( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_GenFsm( char * pFileName, int nIns, int nOuts, int nStates, int nLines, int ProbI, int ProbO );
    int c, nIns, nOuts, nStates, nLines, ProbI, ProbO, fVerbose;
    char * FileName;
    // set defaults
    nIns     =   30;
    nOuts    =    1;
    nStates  =   20;
    nLines   =  100;
    ProbI    =   10;
    ProbO    =  100;
    fVerbose =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IOSLPQvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIns = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIns < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            nOuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOuts < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nStates = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStates < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLines = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLines < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            ProbI = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( ProbI < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            ProbO = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( ProbO < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }
    if ( nIns < 1 || nStates < 1 || nLines < 1 || ProbI < 1 || ProbO < 1 )
    {
        Abc_Print( -1, "The number of inputs. states, lines, and probablity should be positive integers.\n" );
        goto usage;
    }
    // get the input file name
    FileName = argv[globalUtilOptind];
    Abc_GenFsm( FileName, nIns, nOuts, nStates, nLines, ProbI, ProbO );
    return 0;

usage:
    Abc_Print( -2, "usage: genfsm [-IOSLPQ num] [-vh] <file>\n" );
    Abc_Print( -2, "\t         generates random FSM in KISS format\n" );
    Abc_Print( -2, "\t-I num : the number of input variables [default = %d]\n", nIns );
    Abc_Print( -2, "\t-O num : the number of output variables [default = %d]\n", nOuts );
    Abc_Print( -2, "\t-S num : the number of state variables [default = %d]\n", nStates );
    Abc_Print( -2, "\t-L num : the number of lines (product terms) [default = %d]\n", nLines );
    Abc_Print( -2, "\t-P num : percentage propability of a variable present in the input cube [default = %d]\n", ProbI );
    Abc_Print( -2, "\t-Q num : percentage propability of a variable present in the output cube [default = %d]\n", ProbO );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : output file name\n");
    return 1;
}